

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1763749::Toolchains::DumpToolchainVariable
          (Toolchains *this,cmMakefile *mf,Value *object,string *lang,ToolchainVariable *variable)

{
  bool bVar1;
  reference value_00;
  Value *pVVar2;
  string *value_01;
  Value local_128;
  cmValue local_100;
  cmValue def;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  iterator __end3;
  iterator __begin3;
  cmList *__range3;
  Value jsonArray;
  undefined1 local_80 [8];
  cmList values;
  cmValue local_58;
  cmValue data;
  string variableName;
  ToolchainVariable *variable_local;
  string *lang_local;
  Value *object_local;
  cmMakefile *mf_local;
  Toolchains *this_local;
  
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
            ((string *)&data,(char (*) [7])0x1244722,lang,(char (*) [2])0x1272de9,
             &variable->VariableSuffix);
  if ((variable->IsList & 1U) == 0) {
    local_100 = cmMakefile::GetDefinition(mf,(string *)&data);
    bVar1 = cmValue::operator_cast_to_bool(&local_100);
    if (bVar1) {
      value_01 = cmValue::operator*[abi_cxx11_(&local_100);
      Json::Value::Value(&local_128,value_01);
      pVVar2 = Json::Value::operator[](object,&variable->ObjectKey);
      Json::Value::operator=(pVVar2,&local_128);
      Json::Value::~Value(&local_128);
    }
  }
  else {
    local_58 = cmMakefile::GetDefinition(mf,(string *)&data);
    bVar1 = cmValue::operator_cast_to_bool(&local_58);
    if (bVar1) {
      jsonArray.limit_ = (ptrdiff_t)local_58.Value;
      cmList::cmList((cmList *)local_80,local_58,Yes,No);
      Json::Value::Value((Value *)&__range3,arrayValue);
      __end3 = cmList::begin_abi_cxx11_((cmList *)local_80);
      value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              cmList::end_abi_cxx11_((cmList *)local_80);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&value), bVar1) {
        value_00 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
        Json::Value::Value((Value *)&def,value_00);
        Json::Value::append((Value *)&__range3,(Value *)&def);
        Json::Value::~Value((Value *)&def);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      pVVar2 = Json::Value::operator[](object,&variable->ObjectKey);
      Json::Value::operator=(pVVar2,(Value *)&__range3);
      Json::Value::~Value((Value *)&__range3);
      cmList::~cmList((cmList *)local_80);
    }
  }
  std::__cxx11::string::~string((string *)&data);
  return;
}

Assistant:

void Toolchains::DumpToolchainVariable(cmMakefile const* mf,
                                       Json::Value& object,
                                       std::string const& lang,
                                       ToolchainVariable const& variable)
{
  std::string const variableName =
    cmStrCat("CMAKE_", lang, "_", variable.VariableSuffix);

  if (variable.IsList) {
    cmValue data = mf->GetDefinition(variableName);
    if (data) {
      cmList values(data);
      Json::Value jsonArray = Json::arrayValue;
      for (auto const& value : values) {
        jsonArray.append(value);
      }
      object[variable.ObjectKey] = jsonArray;
    }
  } else {
    cmValue def = mf->GetDefinition(variableName);
    if (def) {
      object[variable.ObjectKey] = *def;
    }
  }
}